

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient> *this,
          void *pointer)

{
  if (pointer != (void *)0x0) {
    Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t>::~Own
              ((Own<kj::(anonymous_namespace)::NetworkAddressHttpClient,_std::nullptr_t> *)
               ((long)pointer + 0x18));
    Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t>::dispose
              ((Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t> *)((long)pointer + 8));
  }
  operator_delete(pointer,0x30);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }